

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3fca37::LoopReportController::process_timeseries
          (LoopReportController *this,Caliper *c,CaliperMetadataDB *db,OutputStream *stream,
          LoopInfo *info,Comm *comm)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int local_2fc;
  SnapshotProcessFn local_2d8;
  undefined1 local_2b8 [8];
  FormatProcessor formatter;
  ostream *os;
  undefined1 local_280 [8];
  Aggregator cross_agg;
  QuerySpec spec;
  undefined1 local_d0 [8];
  Aggregator local_agg;
  undefined1 local_b8 [4];
  int blocksize;
  StringConverter local_98;
  int local_64;
  undefined1 local_60 [4];
  int nblocks;
  string name;
  int rec_count;
  int iterations;
  Comm *comm_local;
  LoopInfo *info_local;
  OutputStream *stream_local;
  CaliperMetadataDB *db_local;
  Caliper *c_local;
  LoopReportController *this_local;
  
  name.field_2._12_4_ =
       cali::internal::CustomOutputController::Comm::bcast_int(comm,info->iterations);
  name.field_2._8_4_ = cali::internal::CustomOutputController::Comm::bcast_int(comm,info->count);
  cali::internal::CustomOutputController::Comm::bcast_str((string *)local_60,comm,&info->name);
  if (0 < (int)name.field_2._12_4_) {
    local_64 = 0x14;
    bVar1 = cali::ConfigManager::Options::is_set(&this->m_opts,"timeseries.maxrows");
    if (bVar1) {
      cali::ConfigManager::Options::get_abi_cxx11_
                ((string *)local_b8,&this->m_opts,"timeseries.maxrows","");
      cali::StringConverter::StringConverter(&local_98,(string *)local_b8);
      local_64 = cali::StringConverter::to_int(&local_98,(bool *)0x0);
      cali::StringConverter::~StringConverter(&local_98);
      std::__cxx11::string::~string((string *)local_b8);
    }
    if (local_64 < 1) {
      local_64 = name.field_2._8_4_;
    }
    if (local_64 < (int)name.field_2._8_4_) {
      local_2fc = (int)name.field_2._12_4_ / local_64;
    }
    else {
      local_2fc = 1;
    }
    local_agg.mP.super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = local_2fc;
    spec.preprocess_ops.
    super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::max<int>((int *)((long)&local_agg.mP.
                                 super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 4),
                  (int *)((long)&spec.preprocess_ops.
                                 super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    timeseries_local_aggregation
              ((LoopReportController *)local_d0,(Caliper *)this,(CaliperMetadataDB *)c,(string *)db,
               (int)local_60);
    timeseries_spec((QuerySpec *)
                    &cross_agg.mP.
                     super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,this);
    cali::Aggregator::Aggregator
              ((Aggregator *)local_280,
               (QuerySpec *)
               &cross_agg.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::Aggregator&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)&os,(Aggregator *)local_280);
    cali::Aggregator::flush
              ((Aggregator *)local_d0,&db->super_CaliperMetadataAccessInterface,
               (SnapshotProcessFn *)&os);
    std::
    function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
    ::~function((function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
                 *)&os);
    cali::internal::CustomOutputController::Comm::cross_aggregate(comm,db,(Aggregator *)local_280);
    iVar2 = cali::internal::CustomOutputController::Comm::rank(comm);
    if (iVar2 == 0) {
      formatter.mP.
      super___shared_ptr<cali::FormatProcessor::FormatProcessorImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cali::OutputStream::stream(stream);
      poVar3 = std::operator<<((ostream *)
                               formatter.mP.
                               super___shared_ptr<cali::FormatProcessor::FormatProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,"\nIteration summary (");
      poVar3 = std::operator<<(poVar3,(string *)info);
      std::operator<<(poVar3,"):\n-----------------\n\n");
      cali::FormatProcessor::FormatProcessor
                ((FormatProcessor *)local_2b8,
                 (QuerySpec *)
                 &cross_agg.mP.
                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,stream);
      std::
      function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
      ::function<cali::FormatProcessor&,void>
                ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                  *)&local_2d8,(FormatProcessor *)local_2b8);
      cali::Aggregator::flush
                ((Aggregator *)local_280,&db->super_CaliperMetadataAccessInterface,&local_2d8);
      std::
      function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
      ::~function(&local_2d8);
      cali::FormatProcessor::flush
                ((FormatProcessor *)local_2b8,&db->super_CaliperMetadataAccessInterface);
      cali::FormatProcessor::~FormatProcessor((FormatProcessor *)local_2b8);
    }
    cali::Aggregator::~Aggregator((Aggregator *)local_280);
    cali::QuerySpec::~QuerySpec
              ((QuerySpec *)
               &cross_agg.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cali::Aggregator::~Aggregator((Aggregator *)local_d0);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void process_timeseries(Caliper& c, CaliperMetadataDB& db, OutputStream& stream, const LoopInfo& info, Comm comm)
    {
        int         iterations = comm.bcast_int(info.iterations);
        int         rec_count  = comm.bcast_int(info.count);
        std::string name       = comm.bcast_str(info.name);

        if (iterations > 0) {
            int nblocks = 20;

            if (m_opts.is_set("timeseries.maxrows"))
                nblocks = StringConverter(m_opts.get("timeseries.maxrows")).to_int();
            if (nblocks <= 0)
                nblocks = rec_count;

            int blocksize = rec_count > nblocks ? iterations / nblocks : 1;

            Aggregator local_agg = timeseries_local_aggregation(c, db, name, std::max(blocksize, 1));
            QuerySpec  spec      = timeseries_spec();
            Aggregator cross_agg(spec);

            local_agg.flush(db, cross_agg);
            comm.cross_aggregate(db, cross_agg);

            if (comm.rank() == 0) {
                std::ostream* os = stream.stream();
                *os << "\nIteration summary (" << info.name << "):\n-----------------\n\n";

                FormatProcessor formatter(spec, stream);
                cross_agg.flush(db, formatter);
                formatter.flush(db);
            }
        }
    }